

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void print_rdebug_grammar(Grammar *g,char *pathname)

{
  uint uVar1;
  ElemKind EVar2;
  Declaration *pDVar3;
  Elem *pEVar4;
  Production *pPVar5;
  Rule *pRVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  char *pcVar13;
  char *s;
  Term *pTVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lStack_a0;
  char ver [30];
  
  d_version(ver);
  lVar20 = 0;
  printf("/*\n  Generated by Make DParser Version %s\n",ver);
  puts("  Available at http://dparser.sf.net\n*/\n");
  printf("%%<");
  bVar8 = true;
  for (uVar17 = 0; uVar17 < g->ncode; uVar17 = uVar17 + 1) {
    printf("%s",*(undefined8 *)((long)&g->code->code + lVar20));
    pcVar13 = strstr(*(char **)((long)&g->code->code + lVar20),"<stdio.h>");
    if (pcVar13 != (char *)0x0) {
      bVar8 = false;
    }
    lVar20 = lVar20 + 0x10;
  }
  if (bVar8) {
    puts("\n  #include <stdio.h>");
  }
  printf("%%>\n\n");
  if (g->tokenizer != 0) {
    puts("${declare tokenize}");
  }
  uVar17 = 0;
  do {
    if ((g->declarations).n <= uVar17) {
      if (g->set_op_priority_from_rule != 0) {
        puts("${declare set_op_priority_from_rule}");
      }
      if (g->states_for_all_nterms != 0) {
        puts("${declare all_subparsers}");
      }
      if (g->default_white_space != (char *)0x0) {
        printf("${declare whitespace %s}\n");
      }
      if (g->save_parse_tree != 0) {
        puts("${declare save_parse_tree}");
      }
      if ((g->scanner).code != (char *)0x0) {
        printf("${scanner %s}\n");
      }
      bVar8 = false;
      for (uVar17 = 0; uVar17 < (g->terminals).n; uVar17 = uVar17 + 1) {
        pTVar14 = (g->terminals).v[uVar17];
        if (pTVar14->kind == TERM_TOKEN) {
          pcVar13 = "";
          if (!bVar8) {
            pcVar13 = "${token";
          }
          printf("%s %s",pcVar13,pTVar14->string);
          bVar8 = true;
        }
      }
      if (bVar8) {
        puts("}");
      }
      putchar(10);
      uVar12 = (g->productions).n;
      if (uVar12 == 0) {
        printf("/*\n  There were no productions in the grammar %s\n*/\n",pathname);
      }
      else {
        for (uVar17 = 1; uVar17 < uVar12; uVar17 = uVar17 + 1) {
          pPVar5 = (g->productions).v[uVar17];
          for (uVar18 = 0; uVar18 < (pPVar5->rules).n; uVar18 = uVar18 + 1) {
            lStack_a0 = 0;
            bVar8 = true;
            bVar11 = false;
LAB_0013b59a:
            do {
              bVar10 = bVar11;
              bVar9 = bVar8;
              lVar20 = lStack_a0;
              pRVar6 = (pPVar5->rules).v[uVar18];
              if ((uVar18 == 0) || (!bVar9)) {
                printf("%s%s%s",(&DAT_0014ed90)[lVar20],pPVar5->name,
                       (&PTR_anon_var_dwarf_89aa_0014edb0)[lVar20]);
              }
              else {
                printf("%s","\t|   ");
              }
              pcVar13 = "\\\"";
              if (bVar9) {
                pcVar13 = "\"";
              }
              pcVar15 = "#";
              if (bVar9) {
                pcVar15 = "$";
              }
              for (uVar19 = 0; uVar19 < (pRVar6->elems).n; uVar19 = uVar19 + 1) {
                pEVar4 = (pRVar6->elems).v[uVar19];
                EVar2 = pEVar4->kind;
                pTVar14 = (pEVar4->e).term;
                if (EVar2 == ELEM_UNRESOLVED) {
LAB_0013b67f:
                  printf("%s ",pTVar14);
                  goto LAB_0013b686;
                }
                if (EVar2 != ELEM_TERM) {
                  pTVar14 = *(Term **)pTVar14;
                  goto LAB_0013b67f;
                }
                if (pTVar14->term_name != (char *)0x0) {
                  printf("%s ");
LAB_0013b664:
                  s = (char *)0x0;
                  goto LAB_0013b667;
                }
                switch(pTVar14->kind) {
                case TERM_STRING:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string_single_quote(pTVar14->string);
                    if ((pTVar14->string != (char *)0x0) && (*pTVar14->string != '\0')) {
                      pcVar16 = s;
                      if (!bVar9) {
                        pcVar16 = escape_string_single_quote(s);
                      }
                      printf("\'%s\' ",pcVar16);
                      goto LAB_0013b7a9;
                    }
                  }
                  printf("<EOF> ");
                  break;
                case TERM_REGEX:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar16 = s;
                  if (!bVar9) {
                    pcVar16 = escape_string(s);
                  }
                  printf("%s%s%s ",pcVar13,pcVar16,pcVar13);
LAB_0013b7a9:
                  if ((pTVar14->field_0x2c & 8) != 0) {
                    printf("/i ");
                  }
                  if (pTVar14->term_priority != 0) {
                    printf("%sterm %d ",pcVar15);
                  }
                  break;
                case TERM_CODE:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar16 = "code(\"%s\") ";
                  goto LAB_0013b758;
                case TERM_TOKEN:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar16 = "%s ";
LAB_0013b758:
                  printf(pcVar16,s);
                  break;
                default:
                  d_fail("unknown token kind");
                  goto LAB_0013b664;
                }
LAB_0013b667:
                free(s);
LAB_0013b686:
              }
              if (pRVar6->op_assoc != ASSOC_NONE) {
                uVar7 = *(undefined8 *)(&DAT_0014edd0 + lVar20 * 8);
                pcVar13 = assoc_str(pRVar6->op_assoc);
                printf(" %s%s ",uVar7,pcVar13 + 1);
              }
              if (pRVar6->op_priority != 0) {
                printf("%d ");
              }
              if (pRVar6->rule_assoc != ASSOC_NONE) {
                uVar7 = *(undefined8 *)(&DAT_0014edd0 + lVar20 * 8);
                pcVar13 = assoc_str(pRVar6->rule_assoc);
                printf(" %s%s ",uVar7,pcVar13 + 1);
              }
              if (pRVar6->rule_priority != 0) {
                printf("%d ");
              }
              lStack_a0 = 1;
              bVar8 = false;
              bVar11 = true;
            } while (((bool)(bVar9 & d_rdebug_grammar_level == 1)) ||
                    (lStack_a0 = 1, bVar8 = false, (bool)(bVar9 & d_rdebug_grammar_level == 3)));
            if ((bool)(d_rdebug_grammar_level == 3 & bVar10 | bVar9 & d_rdebug_grammar_level == 2))
            {
              lStack_a0 = 2;
              bVar8 = false;
              bVar11 = false;
              if (bVar10) {
                printf("%s","\\n\"); ]");
                lStack_a0 = 2;
                bVar8 = false;
                bVar11 = false;
              }
              goto LAB_0013b59a;
            }
            printf("%s",&DAT_001473b0 + *(int *)(&DAT_001473b0 + lVar20 * 4));
          }
          puts("\t;");
          putchar(10);
          uVar12 = (g->productions).n;
        }
      }
      return;
    }
    pDVar3 = (g->declarations).v[uVar17];
    pEVar4 = pDVar3->elem;
    uVar1 = pDVar3->kind;
    if (uVar1 == 2) {
      if (g->longest_match == 0) {
        pcVar13 = "${declare all_matches}";
        goto LAB_0013b43d;
      }
      pcVar13 = ((pEVar4->e).nterm)->name;
      pcVar15 = "${declare all_matches %s}\n";
LAB_0013b42f:
      print_declare(pcVar15,pcVar13);
    }
    else if (uVar1 == 1) {
      if (g->longest_match == 0) {
        pcVar13 = ((pEVar4->e).nterm)->name;
        pcVar15 = "${declare longest_match %s}\n";
        goto LAB_0013b42f;
      }
      pcVar13 = "${declare longest_match}";
LAB_0013b43d:
      puts(pcVar13);
    }
    else {
      printf("\n/*\nDeclaration->kind: %d");
      printf("\nElem->kind:        %d\n*/\n",(ulong)pEVar4->kind);
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void print_rdebug_grammar(Grammar *g, char *pathname) {
  char ver[30];
  d_version(ver);

  printf("/*\n  Generated by Make DParser Version %s\n", ver);
  printf("  Available at http://dparser.sf.net\n*/\n\n");

  print_global_code(g);
  print_declarations(g);
  print_productions(g, pathname);
}